

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QFontEngine::FaceId,QFreetypeFace*>::emplace_helper<QFreetypeFace*>
          (QHash<QFontEngine::FaceId,_QFreetypeFace_*> *this,FaceId *key,QFreetypeFace **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QFontEngine::FaceId,_QFreetypeFace_*> *in_RDX;
  Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *in_stack_ffffffffffffff90;
  FaceId *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_>::
  findOrInsert<QFontEngine::FaceId>(in_RSI,&in_RDX->key);
  QHashPrivate::iterator<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_>::node
            ((iterator<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *)in_RDX);
  QHashPrivate::Node<QFontEngine::FaceId,QFreetypeFace*>::createInPlace<QFreetypeFace*>
            (in_RDX,in_stack_ffffffffffffff98,(QFreetypeFace **)in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QFontEngine::FaceId,_QFreetypeFace_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }